

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * cmGlobalNinjaMultiGenerator::GetNinjaImplFilename
                   (string *__return_storage_ptr__,string *config)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_len = 0x10;
  local_38.View_._M_str = "CMakeFiles/impl-";
  local_68.View_._M_str = (config->_M_dataplus)._M_p;
  local_68.View_._M_len = config->_M_string_length;
  cmStrCat<char_const*>(__return_storage_ptr__,&local_38,&local_68,&NINJA_FILE_EXTENSION);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(
  const std::string& config)
{
  return cmStrCat("CMakeFiles/impl-", config,
                  cmGlobalNinjaMultiGenerator::NINJA_FILE_EXTENSION);
}